

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeblock.cpp
# Opt level: O0

CodeBlock * __thiscall cppgenerate::CodeBlock::addLine(CodeBlock *this,string *line)

{
  int iVar1;
  ostream *poVar2;
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *line_local;
  CodeBlock *this_local;
  
  iVar1 = this->m_indent;
  local_18 = line;
  line_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,(long)iVar1,' ',&local_39);
  poVar2 = std::operator<<((ostream *)this,local_38);
  poVar2 = std::operator<<(poVar2,(string *)line);
  std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return this;
}

Assistant:

CodeBlock& CodeBlock::addLine( std::string line ){
    m_text << std::string( m_indent, ' ' ) << line << std::endl;

    return *this;
}